

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void file_handle_reader_ops(FileHandlePool *fhp,int tracker)

{
  fdb_kvs_handle *handle;
  void *ptr;
  int index;
  fdb_status fVar1;
  int iVar2;
  ts_nsec tVar3;
  ts_nsec tVar4;
  uint64_t uVar5;
  size_t sVar6;
  ulong uVar7;
  fdb_kvs_handle *snap_handle;
  void *value;
  size_t valuelen;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_info info;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *local_2a8;
  void *local_2a0;
  size_t local_298;
  fdb_file_handle *local_290;
  fdb_kvs_handle *local_288;
  fdb_file_info local_280;
  fdb_doc *local_238 [32];
  fdb_iterator *local_138 [33];
  
  local_290 = (fdb_file_handle *)0x0;
  local_288 = (fdb_kvs_handle *)0x0;
  local_2a8 = (fdb_kvs_handle *)0x0;
  index = FileHandlePool::getAvailableResource(fhp,&local_290,&local_288);
  tVar3 = get_monotonic_ts();
  fVar1 = fdb_snapshot_open(local_288,&local_2a8,0xffffffffffffffff);
  tVar4 = get_monotonic_ts();
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fdb_assert_die("status == FDB_RESULT_SUCCESS",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                   ,0x1a5,(long)fVar1,0);
  }
  uVar5 = ts_diff(tVar3,tVar4);
  FileHandlePool::collectStat(fhp,3,uVar5);
  if ((tracker * -0x3d70a3d7 + 0x51eb850U >> 2 | tracker * 0x40000000) < 0x28f5c29) {
    local_138[0] = (fdb_iterator *)0x0;
    local_238[0] = (fdb_doc *)0x0;
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_init(local_2a8,local_138,(void *)0x0,0,(void *)0x0,0,0);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1b5,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    FileHandlePool::collectStat(fhp,5,uVar5);
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_get(local_138[0],local_238);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) {
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_doc_free(local_238[0]);
        uVar5 = ts_diff(tVar3,tVar4);
        FileHandlePool::collectStat(fhp,7,uVar5);
      }
      else {
        fdb_assert_die("status == FDB_RESULT_ITERATOR_FAIL",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x1c3,(long)fVar1,0xfffffffffffffff4);
      }
    }
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_close(local_138[0]);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1ca,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    iVar2 = 8;
  }
  else {
    local_2a0 = (void *)0x0;
    fVar1 = fdb_get_file_info(local_290,&local_280);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1d5,(long)fVar1,0);
    }
    if (local_280.doc_count == 0) {
      uVar7 = 0;
    }
    else {
      iVar2 = rand();
      uVar7 = (ulong)(long)iVar2 % local_280.doc_count;
    }
    sprintf((char *)local_138,"key%d",uVar7 & 0xffffffff);
    sprintf((char *)local_238,"body%d",uVar7 & 0xffffffff);
    tVar3 = get_monotonic_ts();
    handle = local_2a8;
    sVar6 = strlen((char *)local_138);
    fVar1 = fdb_get_kv(handle,local_138,sVar6 + 1,&local_2a0,&local_298);
    tVar4 = get_monotonic_ts();
    ptr = local_2a0;
    if (fVar1 == FDB_RESULT_KEY_NOT_FOUND) goto LAB_00106124;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_KEY_NOT_FOUND",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x1e5,(long)fVar1,0xfffffffffffffff7);
      goto LAB_00106124;
    }
    iVar2 = bcmp(local_2a0,local_238,local_298);
    if (iVar2 != 0) {
      __assert_fail("memcmp(value, bodybuf, valuelen) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0x1e0,"void file_handle_reader_ops(FileHandlePool *, int)");
    }
    fdb_free_block(ptr);
    uVar5 = ts_diff(tVar3,tVar4);
    iVar2 = 2;
  }
  FileHandlePool::collectStat(fhp,iVar2,uVar5);
LAB_00106124:
  fVar1 = fdb_kvs_close(local_2a8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fdb_assert_die("status == FDB_RESULT_SUCCESS",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                   ,0x1eb,(long)fVar1,0);
  }
  FileHandlePool::returnResourceToPool(fhp,index);
  return;
}

Assistant:

void file_handle_reader_ops(FileHandlePool *fhp, int tracker) {
    fdb_status status;

    // Acquire handles from pool
    fdb_file_handle *dbfile = nullptr;
    fdb_kvs_handle *db = nullptr;
    fdb_kvs_handle *snap_handle = nullptr;
    const int index = fhp->getAvailableResource(&dbfile, &db);

    // Create an in-memory snapshot
    ts_nsec beginSnap = get_monotonic_ts();
    status = fdb_snapshot_open(db, &snap_handle, FDB_SNAPSHOT_INMEM);
    ts_nsec endSnap = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    fhp->collectStat(IN_MEM_SNAP, ts_diff(beginSnap, endSnap));

    // Iterator ops using the snapshot handle once every 100 times
    if (tracker % 100 == 0) {
        fdb_iterator *iterator = nullptr;
        fdb_doc *rdoc = nullptr;
        ts_nsec begin, end;

        // Initialize iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_init(snap_handle, &iterator,
                                   nullptr, 0, nullptr, 0,
                                   FDB_ITR_NONE);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_INIT, ts_diff(begin, end));

        // Get using iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_get(iterator, &rdoc);
        end = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            fhp->collectStat(ITR_GET, ts_diff(begin, end));
        } else {
            // Block not found, no keys available
            fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                       status, FDB_RESULT_ITERATOR_FAIL);
        }

        // Close iterator
        begin = get_monotonic_ts();
        status = fdb_iterator_close(iterator);
        end = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        fhp->collectStat(ITR_CLOSE, ts_diff(begin, end));
    } else {
        // Try fetching a random doc, using the snapshot handle
        void *value = nullptr;
        size_t valuelen;
        char keybuf[256], bodybuf[256];

        fdb_file_info info;
        status = fdb_get_file_info(dbfile, &info);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
        int i = (info.doc_count > 0) ? rand() % info.doc_count : 0;

        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        ts_nsec beginGet = get_monotonic_ts();
        status = fdb_get_kv(snap_handle,
                            (void*)keybuf, strlen(keybuf) + 1,
                            &value, &valuelen);
        ts_nsec endGet = get_monotonic_ts();
        if (status == FDB_RESULT_SUCCESS) {
            assert(memcmp(value, bodybuf, valuelen) == 0);
            fdb_free_block(value);
            fhp->collectStat(GET, ts_diff(beginGet, endGet));
        } else { // If doc_count is zero
            fdb_assert(status == FDB_RESULT_KEY_NOT_FOUND,
                       status, FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // Close snapshot handle
    status = fdb_kvs_close(snap_handle);
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    // Return resource to pool
    fhp->returnResourceToPool(index);
}